

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

void __thiscall
license::EventRegistry::addEvent
          (EventRegistry *this,EVENT_TYPE event,SEVERITY severity,string *eventParameter)

{
  AuditEvent audit;
  value_type local_218;
  
  local_218.severity = severity;
  local_218.event_type = event;
  strncpy(local_218.param1,(eventParameter->_M_dataplus)._M_p,0xff);
  local_218.param2[0] = '\0';
  std::vector<AuditEvent,_std::allocator<AuditEvent>_>::push_back(&this->logs,&local_218);
  return;
}

Assistant:

void EventRegistry::addEvent(EVENT_TYPE event, SEVERITY severity,
		const string& eventParameter) {
	AuditEvent audit;
	audit.severity = severity;
	audit.event_type = event;
	strncpy(audit.param1, eventParameter.c_str(), 255);
	audit.param2[0] = '\0';
	logs.push_back(audit);
}